

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_std_string_utf.cpp
# Opt level: O2

wstring * ON_UTF_std_string_to_std_wstring
                    (wstring *__return_storage_ptr__,int bTestByteOrder,string *sInputUTF,
                    int sInputUTF_count,uint *error_status,uint error_mask,
                    ON__UINT32 error_code_point,int *end_element_index)

{
  char *sUTF8;
  int sUTF8_count;
  char *sEndElement;
  wstring local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  sUTF8_count = (int)sInputUTF->_M_string_length;
  if (sUTF8_count < sInputUTF_count) {
    if (end_element_index != (int *)0x0) {
      *end_element_index = 0;
    }
    if (error_status != (uint *)0x0) {
      *error_status = 1;
    }
  }
  else {
    if (sInputUTF_count != -1) {
      sUTF8_count = sInputUTF_count;
    }
    sUTF8 = (sInputUTF->_M_dataplus)._M_p;
    sEndElement = sUTF8;
    ON_UTF8_to_std_wstring_abi_cxx11_
              (&local_40,bTestByteOrder,sUTF8,sUTF8_count,error_status,error_mask,error_code_point,
               &sEndElement);
    std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,(wstring *)&local_40);
    std::__cxx11::wstring::~wstring((wstring *)&local_40);
    if (end_element_index != (int *)0x0) {
      *end_element_index = (int)sEndElement - (int)sUTF8;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring ON_UTF_std_string_to_std_wstring(
  int bTestByteOrder,
  const std::string& sInputUTF,
  int sInputUTF_count,
  unsigned int* error_status,
  unsigned int error_mask,
  ON__UINT32 error_code_point,
  int* end_element_index
  ) ON_NOEXCEPT
{
  std::wstring str;
  
  const int sUTF8_length = static_cast<int>(sInputUTF.length());

  if ( sInputUTF_count > sUTF8_length )
  {
    if ( 0 != end_element_index )
      *end_element_index = 0;
    if ( 0 != error_status )
      *error_status = 1;
    return str;
  }
  
  if ( -1 == sInputUTF_count )
    sInputUTF_count = sUTF8_length;

  const char* sInputUTFc_str = sInputUTF.c_str();
  const char* sEndElement = sInputUTFc_str;
  str = ON_UTF8_to_std_wstring(
    bTestByteOrder,
    sInputUTFc_str,
    sInputUTF_count,
    error_status,
    error_mask,
    error_code_point,
    &sEndElement
    );

  if ( 0 != end_element_index )
    *end_element_index = static_cast<int>(sEndElement - sInputUTFc_str);

  return str;
}